

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apdu.c
# Opt level: O3

bool_t apduCmdIsValid(apdu_cmd_t *cmd)

{
  bool_t bVar1;
  uint uVar2;
  
  bVar1 = memIsValid(cmd,0x18);
  uVar2 = 0;
  if ((bVar1 != 0) && (cmd->cdf_len < 0x10000)) {
    bVar1 = memIsValid(cmd + 1,cmd->cdf_len);
    if (bVar1 != 0) {
      uVar2 = (uint)(cmd->rdf_len < 0x10001);
    }
  }
  return uVar2;
}

Assistant:

bool_t apduCmdIsValid(const apdu_cmd_t* cmd)
{
	return memIsValid(cmd, sizeof(apdu_cmd_t)) &&
		cmd->cdf_len < 65536 &&
		memIsValid(cmd->cdf, cmd->cdf_len) &&
		cmd->rdf_len <= 65536;
}